

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Velocitizer.cpp
# Opt level: O1

void __thiscall OpenMD::Velocitizer::randomize(Velocitizer *this,RealType temperature)

{
  undefined4 *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  SimInfo *this_00;
  result_type_conflict1 rVar5;
  int iVar6;
  Molecule *pMVar7;
  pointer ppSVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  ulong uVar12;
  StuntDouble *pSVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  Vector3d j;
  MoleculeIterator mi;
  Vector3d v;
  Mat3x3d I;
  double local_128 [3];
  MoleculeIterator local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  normal_distribution<double> local_e8;
  double local_c8 [19];
  
  bVar14 = 0;
  local_108 = 0;
  uStack_100 = 0;
  local_f8 = 0;
  local_128[2] = 0.0;
  local_128[0] = 0.0;
  local_128[1] = 0.0;
  local_c8[8] = 0.0;
  local_c8[6] = 0.0;
  local_c8[7] = 0.0;
  local_c8[4] = 0.0;
  local_c8[5] = 0.0;
  local_c8[2] = 0.0;
  local_c8[3] = 0.0;
  local_c8[0] = 0.0;
  local_c8[1] = 0.0;
  local_110._M_node = (_Base_ptr)0x0;
  local_e8._M_param._M_mean._0_4_ = 0;
  local_e8._M_param._M_mean._4_4_ = 0;
  local_e8._M_param._M_stddev._0_4_ = 0;
  local_e8._M_param._M_stddev._4_4_ = 0x3ff00000;
  local_e8._M_saved = 0.0;
  local_e8._M_saved_available = false;
  this_00 = this->info_;
  iVar2 = this_00->ndf_;
  iVar3 = this_00->ndfRaw_;
  iVar6 = SimInfo::getFdf(this_00);
  pMVar7 = SimInfo::beginMolecule(this->info_,&local_110);
  if (pMVar7 != (Molecule *)0x0) {
    dVar15 = (double)(iVar2 - iVar6);
    dVar15 = ((double)iVar3 * temperature * 8.31451e-07) / (dVar15 + dVar15);
    dVar15 = dVar15 + dVar15;
    do {
      ppSVar8 = (pMVar7->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar8 ==
          (pMVar7->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar13 = (StuntDouble *)0x0;
      }
      else {
        pSVar13 = *ppSVar8;
      }
      while (pSVar13 != (StuntDouble *)0x0) {
        dVar16 = dVar15 / pSVar13->mass_;
        if (dVar16 < 0.0) {
          dVar16 = sqrt(dVar16);
        }
        else {
          dVar16 = SQRT(dVar16);
        }
        lVar11 = 0;
        do {
          rVar5 = std::normal_distribution<double>::operator()
                            (&local_e8,
                             (this->randNumGen_).
                             super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&local_e8._M_param);
          (&local_108)[lVar11] = rVar5 * dVar16;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
        iVar2 = pSVar13->localIndex_;
        lVar11 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).velocity.
                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
        *(undefined8 *)(lVar11 + 0x10 + (long)iVar2 * 0x18) = local_f8;
        puVar1 = (undefined4 *)(lVar11 + (long)iVar2 * 0x18);
        *puVar1 = (undefined4)local_108;
        puVar1[1] = local_108._4_4_;
        puVar1[2] = (undefined4)uStack_100;
        puVar1[3] = uStack_100._4_4_;
        if (pSVar13->objType_ - otDAtom < 2) {
          (*pSVar13->_vptr_StuntDouble[5])(local_c8 + 10,pSVar13);
          pdVar9 = local_c8 + 10;
          pdVar10 = local_c8;
          for (lVar11 = 9; lVar11 != 0; lVar11 = lVar11 + -1) {
            *pdVar10 = *pdVar9;
            pdVar9 = pdVar9 + (ulong)bVar14 * -2 + 1;
            pdVar10 = pdVar10 + (ulong)bVar14 * -2 + 1;
          }
          if (pSVar13->linear_ == false) {
            lVar11 = 0;
            do {
              dVar16 = *(double *)((long)local_c8 + lVar11 * 4) * dVar15;
              if (dVar16 < 0.0) {
                dVar16 = sqrt(dVar16);
              }
              else {
                dVar16 = SQRT(dVar16);
              }
              rVar5 = std::normal_distribution<double>::operator()
                                (&local_e8,
                                 (this->randNumGen_).
                                 super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,&local_e8._M_param);
              *(double *)((long)local_128 + lVar11) = rVar5 * dVar16;
              lVar11 = lVar11 + 8;
            } while (lVar11 != 0x18);
          }
          else {
            uVar4 = pSVar13->linearAxis_;
            uVar12 = (ulong)(((int)(uVar4 + 1) / 3) * -3 + uVar4 + 1);
            local_128[uVar4] = 0.0;
            dVar16 = local_c8[uVar12 * 4] * dVar15;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            rVar5 = std::normal_distribution<double>::operator()
                              (&local_e8,
                               (this->randNumGen_).
                               super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_e8._M_param);
            local_128[uVar12] = rVar5 * dVar16;
            uVar12 = (ulong)(uVar4 + ((int)(uVar4 + 2) / 3) * -3 + 2);
            dVar16 = local_c8[uVar12 * 4] * dVar15;
            if (dVar16 < 0.0) {
              dVar16 = sqrt(dVar16);
            }
            else {
              dVar16 = SQRT(dVar16);
            }
            rVar5 = std::normal_distribution<double>::operator()
                              (&local_e8,
                               (this->randNumGen_).
                               super___shared_ptr<OpenMD::Utils::RandNumGen,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,&local_e8._M_param);
            local_128[uVar12] = rVar5 * dVar16;
          }
          iVar2 = pSVar13->localIndex_;
          lVar11 = *(long *)((long)&(pSVar13->snapshotMan_->currentSnapshot_->atomData).
                                    angularMomentum.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + pSVar13->storage_);
          *(double *)(lVar11 + 0x10 + (long)iVar2 * 0x18) = local_128[2];
          pdVar9 = (double *)(lVar11 + (long)iVar2 * 0x18);
          *pdVar9 = local_128[0];
          pdVar9[1] = local_128[1];
        }
        ppSVar8 = ppSVar8 + 1;
        if (ppSVar8 ==
            (pMVar7->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar13 = (StuntDouble *)0x0;
        }
        else {
          pSVar13 = *ppSVar8;
        }
      }
      pMVar7 = SimInfo::nextMolecule(this->info_,&local_110);
    } while (pMVar7 != (Molecule *)0x0);
  }
  removeComDrift(this);
  if ((this->globals_->UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b == '\0') {
    removeAngularDrift(this);
  }
  return;
}

Assistant:

void Velocitizer::randomize(RealType temperature) {
    Vector3d v;
    Vector3d j;
    Mat3x3d I;
    int l, m, n;
    Vector3d vdrift;
    RealType vbar;
    RealType jbar;
    RealType av2;
    RealType kebar;

    SimInfo::MoleculeIterator mi;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    StuntDouble* sd;

    std::normal_distribution<RealType> normalDistribution {0.0, 1.0};

    kebar = Constants::kB * temperature * info_->getNdfRaw() /
            (2.0 * info_->getNdf());
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      for (sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd = mol->nextIntegrableObject(ioi)) {
        // uses equipartition theory to solve for vbar in angstrom/fs

        av2  = 2.0 * kebar / sd->getMass();
        vbar = sqrt(av2);

        // picks random velocities from a gaussian distribution
        // centered on vbar

        for (int k = 0; k < 3; k++) {
          v[k] = vbar * normalDistribution(*randNumGen_);
        }
        sd->setVel(v);

        if (sd->isDirectional()) {
          I = sd->getI();

          if (sd->isLinear()) {
            l = sd->linearAxis();
            m = (l + 1) % 3;
            n = (l + 2) % 3;

            j[l] = 0.0;
            jbar = sqrt(2.0 * kebar * I(m, m));
            j[m] = jbar * normalDistribution(*randNumGen_);
            jbar = sqrt(2.0 * kebar * I(n, n));
            j[n] = jbar * normalDistribution(*randNumGen_);
          } else {
            for (int k = 0; k < 3; k++) {
              jbar = sqrt(2.0 * kebar * I(k, k));
              j[k] = jbar * normalDistribution(*randNumGen_);
            }
          }

          sd->setJ(j);
        }
      }
    }

    removeComDrift();

    // Remove angular drift if we are not using periodic boundary
    // conditions:

    if (!globals_->getUsePeriodicBoundaryConditions()) removeAngularDrift();
  }